

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_mla(DisasContext_conflict1 *s,arg_s_rrrr *a,_Bool add)

{
  TCGContext_conflict1 *tcg_ctx;
  undefined1 extraout_AL;
  TCGv_i32 ret;
  TCGv_i32 pTVar1;
  undefined7 in_register_00000011;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  ret = load_reg(s,a->rn);
  pTVar1 = load_reg(s,a->rm);
  tcg_gen_mul_i32(tcg_ctx,ret,ret,pTVar1);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  if ((int)CONCAT71(in_register_00000011,add) != 0) {
    pTVar1 = load_reg(s,a->ra);
    tcg_gen_add_i32(tcg_ctx,ret,ret,pTVar1);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  }
  if (a->s != 0) {
    gen_logic_CC(tcg_ctx,ret);
  }
  store_reg(s,a->rd,ret);
  return (_Bool)extraout_AL;
}

Assistant:

static bool op_mla(DisasContext *s, arg_s_rrrr *a, bool add)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    tcg_gen_mul_i32(tcg_ctx, t1, t1, t2);
    tcg_temp_free_i32(tcg_ctx, t2);
    if (add) {
        t2 = load_reg(s, a->ra);
        tcg_gen_add_i32(tcg_ctx, t1, t1, t2);
        tcg_temp_free_i32(tcg_ctx, t2);
    }
    if (a->s) {
        gen_logic_CC(tcg_ctx, t1);
    }
    store_reg(s, a->rd, t1);
    return true;
}